

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O1

void nghttp2_bufs_reset(nghttp2_bufs *bufs)

{
  uint8_t *puVar1;
  size_t sVar2;
  nghttp2_buf_chain *ptr;
  nghttp2_buf_chain *pnVar3;
  nghttp2_mem *mem;
  nghttp2_bufs *pnVar4;
  size_t sVar5;
  
  sVar5 = bufs->chunk_keep;
  pnVar4 = bufs;
  do {
    pnVar4 = (nghttp2_bufs *)pnVar4->head;
    if (pnVar4 == (nghttp2_bufs *)0x0) goto LAB_0062d61e;
    puVar1 = ((nghttp2_buf *)&pnVar4->cur)->begin;
    pnVar4->chunk_used = (size_t)puVar1;
    pnVar4->max_chunk = (size_t)puVar1;
    pnVar4->chunk_length = (size_t)puVar1;
    sVar2 = bufs->offset;
    pnVar4->chunk_length = (size_t)(puVar1 + sVar2);
    pnVar4->max_chunk = (size_t)(puVar1 + sVar2);
    sVar5 = sVar5 - 1;
  } while (sVar5 != 0);
  ptr = pnVar4->head;
  pnVar4->head = (nghttp2_buf_chain *)0x0;
  while (ptr != (nghttp2_buf_chain *)0x0) {
    pnVar3 = ptr->next;
    mem = bufs->mem;
    nghttp2_mem_free(mem,(ptr->buf).begin);
    (ptr->buf).begin = (uint8_t *)0x0;
    nghttp2_mem_free(mem,ptr);
    ptr = pnVar3;
  }
  bufs->chunk_used = bufs->chunk_keep;
LAB_0062d61e:
  bufs->cur = bufs->head;
  return;
}

Assistant:

void nghttp2_bufs_reset(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *chain, *ci;
  size_t k;

  k = bufs->chunk_keep;

  for (ci = bufs->head; ci; ci = ci->next) {
    nghttp2_buf_reset(&ci->buf);
    nghttp2_buf_shift_right(&ci->buf, bufs->offset);

    if (--k == 0) {
      break;
    }
  }

  if (ci) {
    chain = ci->next;
    ci->next = NULL;

    for (ci = chain; ci;) {
      chain = ci->next;

      buf_chain_del(ci, bufs->mem);

      ci = chain;
    }

    bufs->chunk_used = bufs->chunk_keep;
  }

  bufs->cur = bufs->head;
}